

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  bool bVar1;
  SQChar *in_RDX;
  SQTable *in_RSI;
  SQObjectPtr t;
  SQObjectPtr *this_00;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQObjectValue in_stack_ffffffffffffffd8;
  SQObjectValue local_8;
  
  this_00 = (SQObjectPtr *)&stack0xffffffffffffffd0;
  ::SQObjectPtr::SQObjectPtr(this_00);
  bVar1 = SQTable::GetStr(in_RSI,in_RDX,in_stack_ffffffffffffffd8.nInteger,in_stack_ffffffffffffffd0
                         );
  local_8 = in_stack_ffffffffffffffd8;
  if (!bVar1) {
    local_8.nInteger = 0x102;
  }
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return (SQInteger)local_8.pTable;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}